

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alGetSourcef(ALuint name,ALenum param,ALfloat *value)

{
  float local_1c;
  ALfloat *value_local;
  ALenum param_local;
  ALuint name_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSourcef);
  IO_UINT32(name);
  IO_ENUM(param);
  IO_PTR(value);
  (*REAL_alGetSourcef)(name,param,value);
  if (value == (ALfloat *)0x0) {
    local_1c = 0.0;
  }
  else {
    local_1c = *value;
  }
  IO_FLOAT(local_1c);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSourcef(ALuint name, ALenum param, ALfloat *value)
{
    IO_START(alGetSourcef);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(value);
    REAL_alGetSourcef(name, param, value);
    IO_FLOAT(value ? *value : 0.0f);
    IO_END();
}